

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

amqp_connection_state_t amqp_new_connection(void)

{
  int iVar1;
  amqp_connection_state_t __ptr;
  void *pvVar2;
  amqp_connection_state_t state;
  int res;
  int in_stack_00000010;
  int in_stack_00000014;
  amqp_connection_state_t in_stack_00000018;
  
  __ptr = (amqp_connection_state_t)calloc(1,0x180);
  if (__ptr != (amqp_connection_state_t)0x0) {
    iVar1 = amqp_tune_connection(in_stack_00000018,in_stack_00000014,in_stack_00000010,res);
    if (iVar1 == 0) {
      (__ptr->inbound_buffer).bytes = __ptr->header_buffer;
      (__ptr->inbound_buffer).len = 8;
      __ptr->state = CONNECTION_STATE_INITIAL;
      __ptr->target_size = 8;
      (__ptr->sock_inbound_buffer).len = 0x20000;
      pvVar2 = malloc(0x20000);
      (__ptr->sock_inbound_buffer).bytes = pvVar2;
      if ((__ptr->sock_inbound_buffer).bytes != (void *)0x0) {
        init_amqp_pool(&__ptr->properties_pool,0x200);
        return __ptr;
      }
    }
    free((__ptr->sock_inbound_buffer).bytes);
    free(__ptr);
  }
  return (amqp_connection_state_t)0x0;
}

Assistant:

amqp_connection_state_t amqp_new_connection(void)
{
  int res;
  amqp_connection_state_t state =
    (amqp_connection_state_t) calloc(1, sizeof(struct amqp_connection_state_t_));

  if (state == NULL) {
    return NULL;
  }

  res = amqp_tune_connection(state, 0, AMQP_INITIAL_FRAME_POOL_PAGE_SIZE, 0);
  if (0 != res) {
    goto out_nomem;
  }

  state->inbound_buffer.bytes = state->header_buffer;
  state->inbound_buffer.len = sizeof(state->header_buffer);

  state->state = CONNECTION_STATE_INITIAL;
  /* the server protocol version response is 8 bytes, which conveniently
     is also the minimum frame size */
  state->target_size = 8;

  state->sock_inbound_buffer.len = AMQP_INITIAL_INBOUND_SOCK_BUFFER_SIZE;
  state->sock_inbound_buffer.bytes = malloc(AMQP_INITIAL_INBOUND_SOCK_BUFFER_SIZE);
  if (state->sock_inbound_buffer.bytes == NULL) {
    goto out_nomem;
  }

  init_amqp_pool(&state->properties_pool, 512);

  return state;

out_nomem:
  free(state->sock_inbound_buffer.bytes);
  free(state);
  return NULL;
}